

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O2

unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
 __thiscall
so_5::details::make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>>::
make<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long_const&>
          (make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>> *this,
          prefix_t *args,suffix_t *args_1,unsigned_long *args_2)

{
  quantity<unsigned_long> *this_00;
  
  this_00 = (quantity<unsigned_long> *)operator_new(0x58);
  stats::messages::quantity<unsigned_long>::quantity(this_00,args,args_1,*args_2);
  *(quantity<unsigned_long> **)this = this_00;
  return (__uniq_ptr_data<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}